

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::SwitchStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  undefined2 uVar2;
  bool bVar3;
  SQInteger SVar4;
  longlong *p;
  SQUnsignedInteger SVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  SQFuncState *pSVar9;
  long lVar10;
  SQUnsignedInteger SVar11;
  SQScope __oldscope__;
  SQInstruction local_68;
  SQInteger SStack_60;
  SQInstruction local_50;
  SQInteger local_48;
  SQLexer *local_40;
  SQUnsignedInteger local_38;
  
  local_40 = &this->_lex;
  SVar4 = SQLexer::Lex(local_40);
  this->_token = SVar4;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  Expect(this,0x7b);
  local_48 = SQFuncState::TopTarget(this->_fs);
  pSVar9 = this->_fs;
  SVar5 = (pSVar9->_unresolvedbreaks)._size;
  p = (pSVar9->_breaktargets)._vals;
  uVar8 = (pSVar9->_breaktargets)._allocated;
  uVar6 = (pSVar9->_breaktargets)._size;
  if (uVar8 <= uVar6) {
    SVar11 = 4;
    if (uVar6 * 2 != 0) {
      SVar11 = uVar6 * 2;
    }
    p = (longlong *)sq_vm_realloc(p,uVar8 << 3,SVar11 * 8);
    (pSVar9->_breaktargets)._vals = p;
    (pSVar9->_breaktargets)._allocated = SVar11;
    uVar6 = (pSVar9->_breaktargets)._size;
  }
  (pSVar9->_breaktargets)._size = uVar6 + 1;
  p[uVar6] = 0;
  lVar7 = this->_token;
  if (lVar7 == 300) {
    lVar10 = -1;
    bVar3 = true;
    uVar8 = 0xffffffffffffffff;
    local_38 = SVar5;
    do {
      if (!bVar3) {
        local_68._arg1 = 0;
        local_68.op = '\x1c';
        local_68._arg0 = '\0';
        local_68._arg2 = '\0';
        local_68._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_68);
        uVar8 = (this->_fs->_instructions)._size - 1;
        SQFuncState::SetInstructionParam(this->_fs,lVar10,1,uVar8 - lVar10);
      }
      SVar4 = SQLexer::Lex(local_40);
      this->_token = SVar4;
      Expression(this);
      Expect(this,0x3a);
      SVar5 = SQFuncState::PopTarget(this->_fs);
      bVar3 = SQFuncState::IsLocal(this->_fs,SVar5);
      if (bVar3) {
        SVar4 = SQFuncState::PushTarget(this->_fs,-1);
        local_68._arg0 = (uchar)SVar4;
        local_68._0_5_ = 0xf00000000;
        uVar2 = local_68._4_2_;
        local_68.op = (char)uVar2;
        local_68._arg0 = (char)((ushort)uVar2 >> 8);
        local_68._arg1 = (int)SVar5;
        local_68._arg2 = (char)local_48;
        local_68._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_68);
        local_68._arg0 = (uchar)SVar4;
        local_68._0_5_ = 0x1e00000000;
        local_68 = (SQInstruction)((ulong)local_68._4_2_ << 0x20);
        SQFuncState::AddInstruction(this->_fs,&local_68);
        SQFuncState::PopTarget(this->_fs);
      }
      else {
        local_68._arg0 = (uchar)SVar5;
        local_68._0_5_ = 0xf00000000;
        uVar2 = local_68._4_2_;
        local_68.op = (char)uVar2;
        local_68._arg0 = (char)((ushort)uVar2 >> 8);
        local_68._arg1 = (int)SVar5;
        local_68._arg2 = (char)local_48;
        local_68._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_68);
        local_68._arg0 = (uchar)SVar5;
        local_68._0_5_ = 0x1e00000000;
        local_68 = (SQInstruction)((ulong)local_68._4_2_ << 0x20);
        SQFuncState::AddInstruction(this->_fs,&local_68);
      }
      if (uVar8 != 0xffffffffffffffff) {
        SQFuncState::SetInstructionParam
                  (this->_fs,uVar8,1,~uVar8 + (this->_fs->_instructions)._size);
      }
      pSVar9 = this->_fs;
      SVar11 = (pSVar9->_instructions)._size;
      local_68 = (SQInstruction)(this->_scope).outers;
      SStack_60 = (this->_scope).stacksize;
      (this->_scope).outers = pSVar9->_outers;
      SVar4 = SQFuncState::GetStackSize(pSVar9);
      (this->_scope).stacksize = SVar4;
      Statements(this);
      lVar7 = this->_fs->_outers;
      SVar4 = SQFuncState::GetStackSize(this->_fs);
      lVar10 = (this->_scope).stacksize;
      if (SVar4 != lVar10) {
        SQFuncState::SetStackSize(this->_fs,lVar10);
        if (lVar7 != this->_fs->_outers) {
          local_50._arg1 = (SQInt32)(this->_scope).stacksize;
          local_50.op = '<';
          local_50._arg0 = '\0';
          local_50._arg2 = '\0';
          local_50._arg3 = '\0';
          SQFuncState::AddInstruction(this->_fs,&local_50);
        }
      }
      SVar5 = local_38;
      lVar10 = SVar11 - 1;
      (this->_scope).outers = (SQInteger)local_68;
      (this->_scope).stacksize = SStack_60;
      lVar7 = this->_token;
      bVar3 = false;
    } while (lVar7 == 300);
    if (SVar11 != 0) {
      SQFuncState::SetInstructionParam(this->_fs,lVar10,1,(this->_fs->_instructions)._size - SVar11)
      ;
      lVar7 = this->_token;
    }
  }
  if (lVar7 == 0x12d) {
    SVar4 = SQLexer::Lex(local_40);
    this->_token = SVar4;
    Expect(this,0x3a);
    local_68 = (SQInstruction)(this->_scope).outers;
    SStack_60 = (this->_scope).stacksize;
    pSVar9 = this->_fs;
    (this->_scope).outers = pSVar9->_outers;
    SVar4 = SQFuncState::GetStackSize(pSVar9);
    (this->_scope).stacksize = SVar4;
    Statements(this);
    lVar7 = this->_fs->_outers;
    SVar4 = SQFuncState::GetStackSize(this->_fs);
    lVar10 = (this->_scope).stacksize;
    if (SVar4 != lVar10) {
      SQFuncState::SetStackSize(this->_fs,lVar10);
      if (lVar7 != this->_fs->_outers) {
        local_50._arg1 = (SQInt32)(this->_scope).stacksize;
        local_50.op = '<';
        local_50._arg0 = '\0';
        local_50._arg2 = '\0';
        local_50._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_50);
      }
    }
    (this->_scope).outers = (SQInteger)local_68;
    (this->_scope).stacksize = SStack_60;
  }
  Expect(this,0x7d);
  SQFuncState::PopTarget(this->_fs);
  pSVar9 = this->_fs;
  lVar7 = (pSVar9->_unresolvedbreaks)._size - SVar5;
  if (0 < lVar7) {
    ResolveBreaks(this,pSVar9,lVar7);
    pSVar9 = this->_fs;
  }
  pSVar1 = &(pSVar9->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void SwitchStatement()
    {
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        Expect(_SC('{'));
        SQInteger expr = _fs->TopTarget();
        bool bfirst = true;
        SQInteger tonextcondjmp = -1;
        SQInteger skipcondjmp = -1;
        SQInteger __nbreaks__ = _fs->_unresolvedbreaks.size();
        _fs->_breaktargets.push_back(0);
        while(_token == TK_CASE) {
            if(!bfirst) {
                _fs->AddInstruction(_OP_JMP, 0, 0);
                skipcondjmp = _fs->GetCurrentPos();
                _fs->SetInstructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
            }
            //condition
            Lex(); Expression(); Expect(_SC(':'));
            SQInteger trg = _fs->PopTarget();
            SQInteger eqtarget = trg;
            bool local = _fs->IsLocal(trg);
            if(local) {
                eqtarget = _fs->PushTarget(); //we need to allocate a extra reg
            }
            _fs->AddInstruction(_OP_EQ, eqtarget, trg, expr);
            _fs->AddInstruction(_OP_JZ, eqtarget, 0);
            if(local) {
                _fs->PopTarget();
            }

            //end condition
            if(skipcondjmp != -1) {
                _fs->SetInstructionParam(skipcondjmp, 1, (_fs->GetCurrentPos() - skipcondjmp));
            }
            tonextcondjmp = _fs->GetCurrentPos();
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
            bfirst = false;
        }
        if(tonextcondjmp != -1)
            _fs->SetInstructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
        if(_token == TK_DEFAULT) {
            Lex(); Expect(_SC(':'));
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
        }
        Expect(_SC('}'));
        _fs->PopTarget();
        __nbreaks__ = _fs->_unresolvedbreaks.size() - __nbreaks__;
        if(__nbreaks__ > 0)ResolveBreaks(_fs, __nbreaks__);
        _fs->_breaktargets.pop_back();
    }